

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

Var BranchBailOutRecord::BailOut(BranchBailOutRecord *bailOutRecord,BOOL cond)

{
  RecyclableObject *this;
  code *pcVar1;
  bool bVar2;
  ImplicitCallFlags savedImplicitCallFlags_00;
  uint32 uVar3;
  undefined4 *puVar4;
  JavascriptCallStackLayout *layout_00;
  ScriptContext *pSVar5;
  ThreadContext *pTVar6;
  void *unaff_retaddr;
  ImplicitCallFlags savedImplicitCallFlags;
  ScriptFunction *function;
  JavascriptCallStackLayout *layout;
  void *argoutRestoreAddr;
  BOOL cond_local;
  BranchBailOutRecord *bailOutRecord_local;
  
  if (bailOutRecord == (BranchBailOutRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0xb3c,"(bailOutRecord)","bailOutRecord");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  layout_00 = BailOutRecord::GetStackLayout(&bailOutRecord->super_BailOutRecord);
  this = *(RecyclableObject **)layout_00;
  if ((bailOutRecord->super_BailOutRecord).bailOutKind == BailOutOnImplicitCalls) {
    pSVar5 = Js::RecyclableObject::GetScriptContext(this);
    pTVar6 = Js::ScriptContext::GetThreadContext(pSVar5);
    ThreadContext::CheckAndResetImplicitCallAccessorFlag(pTVar6);
  }
  pSVar5 = Js::RecyclableObject::GetScriptContext(this);
  pTVar6 = Js::ScriptContext::GetThreadContext(pSVar5);
  savedImplicitCallFlags_00 = ThreadContext::GetImplicitCallFlags(pTVar6);
  if (((byte)((bailOutRecord->super_BailOutRecord).globalBailOutRecordTable)->field_0x2c >> 2 & 1)
      == 0) {
    if ((((bailOutRecord->super_BailOutRecord).globalBailOutRecordTable)->field_0x2c & 1) == 0) {
      bailOutRecord_local =
           (BranchBailOutRecord *)
           BailOutFromFunction(layout_00,bailOutRecord,cond,unaff_retaddr,(void *)0x0,
                               savedImplicitCallFlags_00);
    }
    else {
      bailOutRecord_local =
           (BranchBailOutRecord *)
           BailOutInlined(layout_00,bailOutRecord,cond,unaff_retaddr,savedImplicitCallFlags_00);
    }
  }
  else if ((((bailOutRecord->super_BailOutRecord).globalBailOutRecordTable)->field_0x2c & 1) == 0) {
    uVar3 = BailOutFromLoopBody(layout_00,bailOutRecord,cond);
    bailOutRecord_local = (BranchBailOutRecord *)(ulong)uVar3;
  }
  else {
    uVar3 = BailOutFromLoopBodyInlined(layout_00,bailOutRecord,cond,unaff_retaddr);
    bailOutRecord_local = (BranchBailOutRecord *)(ulong)uVar3;
  }
  return bailOutRecord_local;
}

Assistant:

Js::Var BranchBailOutRecord::BailOut(BranchBailOutRecord const * bailOutRecord, BOOL cond)
{
    Assert(bailOutRecord);

    void * argoutRestoreAddr = nullptr;
#ifdef _M_IX86
    void * addressOfRetAddress = _AddressOfReturnAddress();
    if (bailOutRecord->ehBailoutData && (bailOutRecord->ehBailoutData->catchOffset != 0 || bailOutRecord->ehBailoutData->finallyOffset != 0 || bailOutRecord->ehBailoutData->ht == Js::HandlerType::HT_Finally))
    {
        argoutRestoreAddr = (void *)((char*)addressOfRetAddress + ((2 + 1) * MachPtr)); // Account for the parameters and return address of this function
    }
#endif

    Js::JavascriptCallStackLayout *const layout = bailOutRecord->GetStackLayout();
    Js::ScriptFunction * function = (Js::ScriptFunction *)layout->functionObject;

    if (bailOutRecord->bailOutKind == IR::BailOutOnImplicitCalls)
    {
        function->GetScriptContext()->GetThreadContext()->CheckAndResetImplicitCallAccessorFlag();
    }

    Js::ImplicitCallFlags savedImplicitCallFlags = function->GetScriptContext()->GetThreadContext()->GetImplicitCallFlags();

    if(bailOutRecord->globalBailOutRecordTable->isLoopBody)
    {
        if (bailOutRecord->globalBailOutRecordTable->isInlinedFunction)
        {
            return reinterpret_cast<Js::Var>(BailOutFromLoopBodyInlined(layout, bailOutRecord, cond, _ReturnAddress()));
        }
        return reinterpret_cast<Js::Var>(BailOutFromLoopBody(layout, bailOutRecord, cond));
    }
    if(bailOutRecord->globalBailOutRecordTable->isInlinedFunction)
    {
        return BailOutInlined(layout, bailOutRecord, cond, _ReturnAddress(), savedImplicitCallFlags);
    }
    return BailOutFromFunction(layout, bailOutRecord, cond, _ReturnAddress(), argoutRestoreAddr, savedImplicitCallFlags);
}